

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseRegisterCommand(WastParser *this,CommandPtr *out_command)

{
  string_view module_name;
  bool bVar1;
  Result RVar2;
  RegisterCommand *this_00;
  Var local_108;
  undefined4 local_c0;
  Enum local_bc;
  undefined1 local_b8 [8];
  Var var;
  string text;
  undefined1 local_48 [8];
  Location loc;
  CommandPtr *out_command_local;
  WastParser *this_local;
  
  loc.field_1._12_4_ = Expect(this,Lpar);
  bVar1 = Failed((Result)loc.field_1._12_4_);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    GetLocation((Location *)local_48,this);
    RVar2 = Expect(this,Register);
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      std::__cxx11::string::string((string *)((long)&var.field_2 + 0x18));
      Var::Var((Var *)local_b8);
      local_bc = (Enum)ParseQuotedText(this,(string *)((long)&var.field_2 + 0x18),true);
      bVar1 = Failed((Result)local_bc);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
      else {
        Var::Var(&local_108,this->last_module_index_,(Location *)local_48);
        ParseVarOpt(this,(Var *)local_b8,&local_108);
        Var::~Var(&local_108);
        RVar2 = Expect(this,Rpar);
        bVar1 = Failed(RVar2);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
        }
        else {
          this_00 = (RegisterCommand *)operator_new(0x78);
          module_name = (string_view)
                        std::__cxx11::string::operator_cast_to_basic_string_view
                                  ((string *)((long)&var.field_2 + 0x18));
          RegisterCommand::RegisterCommand(this_00,module_name,(Var *)local_b8);
          std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>::reset
                    (out_command,(pointer)this_00);
          Result::Result((Result *)((long)&this_local + 4),Ok);
        }
      }
      local_c0 = 1;
      Var::~Var((Var *)local_b8);
      std::__cxx11::string::~string((string *)((long)&var.field_2 + 0x18));
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseRegisterCommand(CommandPtr* out_command) {
  WABT_TRACE(ParseRegisterCommand);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Register);
  std::string text;
  Var var;
  CHECK_RESULT(ParseQuotedText(&text));
  ParseVarOpt(&var, Var(last_module_index_, loc));
  EXPECT(Rpar);
  out_command->reset(new RegisterCommand(text, var));
  return Result::Ok;
}